

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::DEC_AB(CPU *this)

{
  uint16_t address;
  byte bVar1;
  byte data;
  
  this->cycles = 6;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  this->cycles = this->cycles - 1;
  data = (byte)(bVar1 - 1);
  WriteByte(this,address,data);
  (this->field_6).ps = data & 0x80 | ((ushort)(bVar1 - 1) == 0) * '\x02' | (this->field_6).ps & 0x7d
  ;
  return;
}

Assistant:

void CPU::DEC_AB()
{
    cycles = 6;
    uint16_t addr = GetWord(), result = ReadByte(addr) - 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}